

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::callable>::
holder<cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>
          (holder<cs::callable> *this,
          _func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *args)

{
  types type;
  baseHolder *in_RDI;
  function_type *func;
  callable *in_stack_ffffffffffffffc0;
  function_type local_30;
  
  baseHolder::baseHolder(in_RDI);
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_006b5588;
  type = (types)((ulong)(in_RDI + 1) >> 0x20);
  func = &local_30;
  std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>::
  function<cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),void>
            (&in_stack_ffffffffffffffc0->mFunc,
             (_func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)func);
  cs::callable::callable(in_stack_ffffffffffffffc0,func,type);
  std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
  ~function((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *)
            0x4c9f88);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}